

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob.cpp
# Opt level: O2

void duckdb::GlobTableFunction::RegisterFunction(BuiltinFunctions *set)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_402;
  allocator local_401;
  LogicalType local_400;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3e8;
  string local_3d0;
  FunctionSet<duckdb::TableFunction> local_3b0;
  TableFunction local_378;
  TableFunction glob_function;
  
  ::std::__cxx11::string::string((string *)&local_3d0,"glob",&local_401);
  LogicalType::LogicalType(&local_400,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_400;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3e8,__l,&local_402);
  TableFunction::TableFunction
            (&glob_function,&local_3d0,(vector<duckdb::LogicalType,_true> *)&local_3e8,GlobFunction,
             GlobFunctionBind,GlobFunctionInit,(table_function_init_local_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3e8);
  LogicalType::~LogicalType(&local_400);
  ::std::__cxx11::string::~string((string *)&local_3d0);
  TableFunction::TableFunction(&local_378,&glob_function);
  MultiFileReader::CreateFunctionSet((TableFunctionSet *)&local_3b0,&local_378);
  BuiltinFunctions::AddFunction(set,(TableFunctionSet *)&local_3b0);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_3b0);
  TableFunction::~TableFunction(&local_378);
  TableFunction::~TableFunction(&glob_function);
  return;
}

Assistant:

void GlobTableFunction::RegisterFunction(BuiltinFunctions &set) {
	TableFunction glob_function("glob", {LogicalType::VARCHAR}, GlobFunction, GlobFunctionBind, GlobFunctionInit);
	set.AddFunction(MultiFileReader::CreateFunctionSet(glob_function));
}